

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O3

lws_tokenize_elem lws_tokenize(lws_tokenize *ts)

{
  size_t sVar1;
  byte c;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  lws_tokenize_elem lVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  void *pvVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  uint __c;
  size_t sVar15;
  size_t local_60;
  char local_58;
  
  uVar2 = ts->flags;
  iVar5 = 0;
  uVar4 = 0x2d;
  if ((uVar2 & 1) != 0) {
    uVar4 = 0;
  }
  uVar11 = 0x2e;
  if ((uVar2 & 0x10) != 0) {
    uVar11 = 0;
  }
  ts->token = (char *)0x0;
  ts->token_len = 0;
  if (ts->len != 0) {
    local_58 = ((uVar2 >> 6 & 1) != 0) + -1;
    bVar14 = true;
    local_60 = 0;
    bVar3 = false;
    lVar13 = 0;
    pbVar7 = (byte *)ts->start;
    sVar15 = ts->len;
    do {
      uVar12 = (uint)lVar13;
      pbVar8 = pbVar7 + 1;
      ts->start = (char *)pbVar8;
      c = *pbVar7;
      sVar1 = sVar15 - 1;
      ts->len = sVar1;
      iVar5 = lws_check_byte_utf8((uchar)iVar5,c);
      if (iVar5 < 0) {
        return LWS_TOKZE_ERR_BROKEN_UTF8;
      }
      __c = (uint)c;
      if (c == 0) break;
      if (bVar14) {
        __c = (uint)(char)c;
        if ((-1 < (char)(byte)uVar2) || ((uVar12 == 1 || (c != 0x23)))) goto LAB_0010f3c4;
LAB_0010f3b9:
        bVar14 = false;
      }
      else {
        if ((__c != 0xd) && (c != 10)) goto LAB_0010f3b9;
LAB_0010f3c4:
        if (c < 0x3e) {
          uVar9 = (ulong)c;
          if ((0x100003600U >> (uVar9 & 0x3f) & 1) != 0) {
            lVar6 = (*(code *)(&DAT_0013bfc0 + *(int *)(&DAT_0013bfc0 + lVar13 * 4)))();
            return lVar6;
          }
          if (uVar9 != 0x22) {
            if (uVar9 != 0x3d) goto LAB_0010f43b;
            if ((uVar12 & 0xfffffffe) == 2) {
              if (local_58 == '\x01') {
                return LWS_TOKZE_ERR_NUM_ON_LHS;
              }
              return LWS_TOKZE_ERRS;
            }
            goto LAB_0010f4aa;
          }
          if (uVar12 == 1) {
            return LWS_TOKZE_QUOTED_STRING;
          }
          if ((uVar2 & 4) != 0) {
            if (ts->delim == '\x01') {
              return LWS_TOKZE_ERR_COMMA_LIST;
            }
            ts->delim = '\x01';
          }
          ts->token = (char *)pbVar8;
          ts->token_len = 0;
          bVar14 = true;
          lVar13 = 1;
          local_60 = 0;
        }
        else {
LAB_0010f43b:
          if (((c == 0x3a && (uVar12 & 0xfffffffe) == 2) & (byte)((uVar2 & 2) >> 1)) != 0) {
            return LWS_TOKZE_TOKEN_NAME_COLON;
          }
          if ((((c == 0x2e) && ((uVar2 & 0x20) == 0)) && (uVar12 == 2)) && (local_58 == '\x01')) {
            if (bVar3) {
              return LWS_TOKZE_ERR_MALFORMED_FLOAT;
            }
            local_60 = local_60 + 1;
            ts->token_len = local_60;
            bVar3 = true;
            lVar13 = 2;
            local_58 = '\x01';
LAB_0010f5dd:
            bVar14 = true;
          }
          else {
LAB_0010f4aa:
            if (iVar5 == 0) {
              if ((uVar2 & 8) == 0) {
                if ((0xe5 < (byte)(c + 0xa5) || 0xf5 < (byte)(c - 0x3a)) ||
                   ((byte)(__c == 0x2e & (byte)(uVar2 >> 4) & 0xf |
                          __c == 0x2d & (byte)uVar2 | (c == 0x5f || (byte)(c + 0x9f) < 0x1a)) == 1))
                {
LAB_0010f632:
                  if ((uVar4 != __c) && (uVar11 != __c)) goto LAB_0010f4af;
                }
              }
              else {
                pvVar10 = memchr("(),/:;<=>?@[\\]{}",__c,0x11);
                if (((char)c < '!') || (pvVar10 == (void *)0x0)) goto LAB_0010f632;
              }
              if (((uVar2 >> 8 & 1) != 0) && (c == 0x2f)) goto LAB_0010f4af;
              if (uVar12 == 1) {
                local_60 = local_60 + 1;
                ts->token_len = local_60;
                bVar14 = true;
                lVar13 = 1;
                goto LAB_0010f5ec;
              }
              if (1 < uVar12 - 2) {
                if ((uVar2 & 4) != 0) {
                  if (c != 0x2c) {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  if (ts->delim != '\x01') {
                    return LWS_TOKZE_ERR_COMMA_LIST;
                  }
                  ts->delim = '\x02';
                }
                ts->token = (char *)pbVar7;
                ts->token_len = 1;
                return LWS_TOKZE_DELIMITER;
              }
LAB_0010f6fa:
              ts->start = (char *)pbVar7;
              ts->len = sVar15;
              goto LAB_0010f706;
            }
LAB_0010f4af:
            if (uVar12 - 1 < 2) {
              local_60 = local_60 + 1;
            }
            else {
              if (uVar12 != 0) goto LAB_0010f6fa;
              if ((uVar2 & 4) != 0) {
                if (ts->delim == '\x01') {
                  return LWS_TOKZE_ERR_COMMA_LIST;
                }
                ts->delim = '\x01';
              }
              ts->token = (char *)pbVar7;
              lVar13 = 2;
              local_60 = 1;
            }
            ts->token_len = local_60;
            bVar14 = true;
            if ((uVar2 & 0x40) == 0) {
              if (0xf5 < (byte)(c - 0x3a)) {
                if (local_58 < '\0') {
                  local_58 = '\x01';
                }
                goto LAB_0010f5dd;
              }
              local_58 = '\0';
            }
          }
        }
      }
LAB_0010f5ec:
      uVar12 = (uint)lVar13;
      pbVar7 = pbVar8;
      sVar15 = sVar1;
    } while (sVar1 != 0);
    if (iVar5 != 0) {
      return LWS_TOKZE_ERR_BROKEN_UTF8;
    }
    if (uVar12 == 1) {
      return LWS_TOKZE_ERR_UNTERM_STRING;
    }
    if (0xfffffffd < uVar12 - 4) {
LAB_0010f706:
      if (local_58 == '\x01') {
        return LWS_TOKZE_FLOAT - (uint)!bVar3;
      }
      return LWS_TOKZE_TOKEN;
    }
  }
  if (((uVar2 & 4) == 0) || (lVar6 = LWS_TOKZE_ERR_COMMA_LIST, ts->delim != '\x02')) {
    lVar6 = LWS_TOKZE_ENDED;
  }
  return lVar6;
}

Assistant:

lws_tokenize_elem
lws_tokenize(struct lws_tokenize *ts)
{
	const char *rfc7230_delims = "(),/:;<=>?@[\\]{}";
	lws_tokenize_state state = LWS_TOKZS_LEADING_WHITESPACE;
	char c, flo = 0, d_minus = '-', d_dot = '.', s_minus = '\0',
	     s_dot = '\0', skipping = 0;
	signed char num = (ts->flags & LWS_TOKENIZE_F_NO_INTEGERS) ? 0 : -1;
	int utf8 = 0;

	/* for speed, compute the effect of the flags outside the loop */

	if (ts->flags & LWS_TOKENIZE_F_MINUS_NONTERM) {
		d_minus = '\0';
		s_minus = '-';
	}
	if (ts->flags & LWS_TOKENIZE_F_DOT_NONTERM) {
		d_dot = '\0';
		s_dot = '.';
	}

	ts->token = NULL;
	ts->token_len = 0;

	while (ts->len) {
		c = *ts->start++;
		ts->len--;

		utf8 = lws_check_byte_utf8((unsigned char)utf8, c);
		if (utf8 < 0)
			return LWS_TOKZE_ERR_BROKEN_UTF8;

		if (!c)
			break;

		if (skipping) {
			if (c != '\r' && c != '\n')
				continue;
			else
				skipping = 0;
		}

		/* comment */

		if (ts->flags & LWS_TOKENIZE_F_HASH_COMMENT &&
		    state != LWS_TOKZS_QUOTED_STRING &&
		    c == '#') {
			skipping = 1;
			continue;
		}

		/* whitespace */

		if (c == ' ' || c == '\t' || c == '\n' || c == '\r' ||
		    c == '\f') {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
			case LWS_TOKZS_TOKEN_POST_TERMINAL:
				continue;
			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;
			case LWS_TOKZS_TOKEN:
				/* we want to scan forward to look for = */

				state = LWS_TOKZS_TOKEN_POST_TERMINAL;
				continue;
			}
		}

		/* quoted string */

		if (c == '\"') {
			if (state == LWS_TOKZS_QUOTED_STRING)
				return LWS_TOKZE_QUOTED_STRING;

			/* starting a quoted string */

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_QUOTED_STRING;
			ts->token = ts->start;
			ts->token_len = 0;

			continue;
		}

		/* token= aggregation */

		if (c == '=' && (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
				 state == LWS_TOKZS_TOKEN)) {
			if (num == 1)
				return LWS_TOKZE_ERR_NUM_ON_LHS;
			/* swallow the = */
			return LWS_TOKZE_TOKEN_NAME_EQUALS;
		}

		/* optional token: aggregation */

		if ((ts->flags & LWS_TOKENIZE_F_AGG_COLON) && c == ':' &&
		    (state == LWS_TOKZS_TOKEN_POST_TERMINAL ||
		     state == LWS_TOKZS_TOKEN))
			/* swallow the : */
			return LWS_TOKZE_TOKEN_NAME_COLON;

		/* aggregate . in a number as a float */

		if (c == '.' && !(ts->flags & LWS_TOKENIZE_F_NO_FLOATS) &&
		    state == LWS_TOKZS_TOKEN && num == 1) {
			if (flo)
				return LWS_TOKZE_ERR_MALFORMED_FLOAT;
			flo = 1;
			ts->token_len++;
			continue;
		}

		/*
		 * Delimiter... by default anything that:
		 *
		 *  - isn't matched earlier, or
		 *  - is [A-Z, a-z, 0-9, _], and
		 *  - is not a partial utf8 char
		 *
		 * is a "delimiter", it marks the end of a token and is itself
		 * reported as a single LWS_TOKZE_DELIMITER each time.
		 *
		 * However with LWS_TOKENIZE_F_RFC7230_DELIMS flag, tokens may
		 * contain any noncontrol character that isn't defined in
		 * rfc7230_delims, and only characters listed there are treated
		 * as delimiters.
		 */

		if (!utf8 &&
		     ((ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS &&
		     strchr(rfc7230_delims, c) && c > 32) ||
		    ((!(ts->flags & LWS_TOKENIZE_F_RFC7230_DELIMS) &&
		     (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
		     (c < 'a' || c > 'z') && c != '_') &&
		     c != s_minus && c != s_dot) ||
		    c == d_minus || c == d_dot
		    ) &&
		    !((ts->flags & LWS_TOKENIZE_F_SLASH_NONTERM) && c == '/')) {
			switch (state) {
			case LWS_TOKZS_LEADING_WHITESPACE:
				if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
					if (c != ',' ||
					    ts->delim != LWSTZ_DT_NEED_DELIM)
						return LWS_TOKZE_ERR_COMMA_LIST;
					ts->delim = LWSTZ_DT_NEED_NEXT_CONTENT;
				}

				ts->token = ts->start - 1;
				ts->token_len = 1;
				return LWS_TOKZE_DELIMITER;

			case LWS_TOKZS_QUOTED_STRING:
				ts->token_len++;
				continue;

			case LWS_TOKZS_TOKEN_POST_TERMINAL:
			case LWS_TOKZS_TOKEN:
				/* report the delimiter next time */
				ts->start--;
				ts->len++;
				goto token_or_numeric;
			}
		}

		/* anything that's not whitespace or delimiter is payload */

		switch (state) {
		case LWS_TOKZS_LEADING_WHITESPACE:

			if (ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) {
				if (ts->delim == LWSTZ_DT_NEED_DELIM)
					return LWS_TOKZE_ERR_COMMA_LIST;
				ts->delim = LWSTZ_DT_NEED_DELIM;
			}

			state = LWS_TOKZS_TOKEN;
			ts->token = ts->start - 1;
			ts->token_len = 1;
			goto checknum;

		case LWS_TOKZS_QUOTED_STRING:
		case LWS_TOKZS_TOKEN:
			ts->token_len++;
checknum:
			if (!(ts->flags & LWS_TOKENIZE_F_NO_INTEGERS)) {
				if (c < '0' || c > '9')
					num = 0;
				else
					if (num < 0)
						num = 1;
			}
			continue;

		case LWS_TOKZS_TOKEN_POST_TERMINAL:
			/* report the new token next time */
			ts->start--;
			ts->len++;
			goto token_or_numeric;
		}
	}

	/* we ran out of content */

	if (utf8) /* ended partway through a multibyte char */
		return LWS_TOKZE_ERR_BROKEN_UTF8;

	if (state == LWS_TOKZS_QUOTED_STRING)
		return LWS_TOKZE_ERR_UNTERM_STRING;

	if (state != LWS_TOKZS_TOKEN_POST_TERMINAL &&
	    state != LWS_TOKZS_TOKEN) {
		if ((ts->flags & LWS_TOKENIZE_F_COMMA_SEP_LIST) &&
		     ts->delim == LWSTZ_DT_NEED_NEXT_CONTENT)
			return LWS_TOKZE_ERR_COMMA_LIST;

		return LWS_TOKZE_ENDED;
	}

	/* report the pending token */

token_or_numeric:

	if (num != 1)
		return LWS_TOKZE_TOKEN;
	if (flo)
		return LWS_TOKZE_FLOAT;

	return LWS_TOKZE_INTEGER;
}